

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCase.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
vkt::getValidationLayers_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,vkt *this,
          vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *supportedLayers)

{
  char *pcVar1;
  vkt *pvVar2;
  bool bVar3;
  allocator<char> local_209;
  value_type local_208;
  Maybe<unsigned_int> local_1e8;
  Maybe<unsigned_int> local_1d8;
  Maybe<unsigned_int> local_1c8;
  Maybe<unsigned_int> local_1b8;
  allocator<char> local_1a1;
  string local_1a0;
  RequiredLayer local_180;
  int local_120;
  allocator<char> local_119;
  int ndx;
  Maybe<unsigned_int> local_f8;
  Maybe<unsigned_int> local_e8;
  Maybe<unsigned_int> local_d8;
  Maybe<unsigned_int> local_c8 [2];
  allocator<char> local_a1;
  string local_a0;
  RequiredLayer local_80;
  undefined1 local_19;
  vkt *local_18;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *supportedLayers_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *enabledLayers;
  
  local_19 = 0;
  local_18 = this;
  supportedLayers_local =
       (vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
       __return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  pvVar2 = local_18;
  pcVar1 = getValidationLayers::s_magicLayer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
  tcu::nothing<unsigned_int>();
  tcu::nothing<unsigned_int>();
  tcu::nothing<unsigned_int>();
  tcu::nothing<unsigned_int>();
  ::vk::RequiredLayer::RequiredLayer(&local_80,&local_a0,local_c8,&local_d8,&local_e8,&local_f8);
  bVar3 = ::vk::isLayerSupported
                    ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)pvVar2
                     ,&local_80);
  ::vk::RequiredLayer::~RequiredLayer(&local_80);
  tcu::Maybe<unsigned_int>::~Maybe(&local_f8);
  tcu::Maybe<unsigned_int>::~Maybe(&local_e8);
  tcu::Maybe<unsigned_int>::~Maybe(&local_d8);
  tcu::Maybe<unsigned_int>::~Maybe(local_c8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pcVar1 = getValidationLayers::s_magicLayer;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&ndx,pcVar1,&local_119);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&ndx);
    std::__cxx11::string::~string((string *)&ndx);
    std::allocator<char>::~allocator(&local_119);
  }
  else {
    for (local_120 = 0; pvVar2 = local_18, local_120 < 8; local_120 = local_120 + 1) {
      pcVar1 = getValidationLayers::s_defaultLayers[local_120];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,pcVar1,&local_1a1);
      tcu::nothing<unsigned_int>();
      tcu::nothing<unsigned_int>();
      tcu::nothing<unsigned_int>();
      tcu::nothing<unsigned_int>();
      ::vk::RequiredLayer::RequiredLayer
                (&local_180,&local_1a0,&local_1b8,&local_1c8,&local_1d8,&local_1e8);
      bVar3 = ::vk::isLayerSupported
                        ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
                         pvVar2,&local_180);
      ::vk::RequiredLayer::~RequiredLayer(&local_180);
      tcu::Maybe<unsigned_int>::~Maybe(&local_1e8);
      tcu::Maybe<unsigned_int>::~Maybe(&local_1d8);
      tcu::Maybe<unsigned_int>::~Maybe(&local_1c8);
      tcu::Maybe<unsigned_int>::~Maybe(&local_1b8);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
      if (bVar3) {
        pcVar1 = getValidationLayers::s_defaultLayers[local_120];
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,pcVar1,&local_209);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> getValidationLayers (const vector<VkLayerProperties>& supportedLayers)
{
	static const char*	s_magicLayer		= "VK_LAYER_LUNARG_standard_validation";
	static const char*	s_defaultLayers[]	=
	{
		"VK_LAYER_GOOGLE_threading",
		"VK_LAYER_LUNARG_parameter_validation",
		"VK_LAYER_LUNARG_device_limits",
		"VK_LAYER_LUNARG_object_tracker",
		"VK_LAYER_LUNARG_image",
		"VK_LAYER_LUNARG_core_validation",
		"VK_LAYER_LUNARG_swapchain",
		"VK_LAYER_GOOGLE_unique_objects"
	};

	vector<string>		enabledLayers;

	if (isLayerSupported(supportedLayers, RequiredLayer(s_magicLayer)))
		enabledLayers.push_back(s_magicLayer);
	else
	{
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_defaultLayers); ++ndx)
		{
			if (isLayerSupported(supportedLayers, RequiredLayer(s_defaultLayers[ndx])))
				enabledLayers.push_back(s_defaultLayers[ndx]);
		}
	}

	return enabledLayers;
}